

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

void __thiscall HighsSymmetryDetection::initializeGroundSet(HighsSymmetryDetection *this)

{
  pointer piVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  size_type __new_size;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar14;
  undefined1 auVar13 [16];
  value_type_conflict2 local_20 [2];
  undefined1 auVar12 [16];
  
  std::vector<int,_std::allocator<int>_>::operator=(&this->vertexGroundSet,&this->currentPartition);
  piVar1 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    uVar6 = (long)piVar2 - (long)piVar1 >> 2;
    iVar7 = 0;
    if (1 < uVar6) {
      iVar7 = 0;
      do {
        uVar6 = (long)uVar6 >> 1;
        iVar7 = iVar7 + 1;
      } while (1 < uVar6);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
              (piVar1,piVar2,iVar7,1);
  }
  local_20[1] = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->vertexPosition,
             (long)(this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,local_20 + 1);
  __new_size = (size_type)this->numVertices;
  if (0 < (long)__new_size) {
    piVar1 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      piVar2[piVar1[lVar8]] = (int)lVar8;
      lVar8 = lVar8 + 1;
      __new_size = (size_type)this->numVertices;
    } while (lVar8 < (long)__new_size);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->orbitPartition,__new_size);
  auVar5 = _DAT_003bf640;
  auVar4 = _DAT_003beea0;
  auVar3 = _DAT_003bee90;
  piVar1 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    uVar6 = (long)piVar2 + (-4 - (long)piVar1);
    auVar13._8_4_ = (int)uVar6;
    auVar13._0_8_ = uVar6;
    auVar13._12_4_ = (int)(uVar6 >> 0x20);
    auVar10._0_8_ = uVar6 >> 2;
    auVar10._8_8_ = auVar13._8_8_ >> 2;
    uVar9 = 0;
    auVar10 = auVar10 ^ _DAT_003beea0;
    do {
      iVar11 = (int)uVar9;
      auVar12._8_4_ = iVar11;
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = (int)(uVar9 >> 0x20);
      auVar13 = (auVar12 | auVar3) ^ auVar4;
      iVar7 = auVar10._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar7 && auVar10._0_4_ < auVar13._0_4_ || iVar7 < auVar13._4_4_)
                & 1)) {
        piVar1[uVar9] = iVar11;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        piVar1[uVar9 + 1] = iVar11 + 1;
      }
      auVar13 = (auVar12 | auVar5) ^ auVar4;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar7 && (iVar14 != iVar7 || auVar13._0_4_ <= auVar10._0_4_)) {
        piVar1[uVar9 + 2] = iVar11 + 2;
        piVar1[uVar9 + 3] = iVar11 + 3;
      }
      uVar9 = uVar9 + 4;
    } while (((uVar6 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
  }
  local_20[0] = 1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->orbitSize,(long)this->numVertices,local_20);
  std::vector<int,_std::allocator<int>_>::resize(&this->automorphisms,(long)this->numVertices << 6);
  this->numAutomorphisms = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->currNodeCertificate,(long)this->numVertices);
  return;
}

Assistant:

void HighsSymmetryDetection::initializeGroundSet() {
  vertexGroundSet = currentPartition;
  pdqsort(vertexGroundSet.begin(), vertexGroundSet.end());
  vertexPosition.resize(vertexToCell.size(), -1);
  for (HighsInt i = 0; i < numVertices; ++i)
    vertexPosition[vertexGroundSet[i]] = i;

  orbitPartition.resize(numVertices);
  std::iota(orbitPartition.begin(), orbitPartition.end(), 0);
  orbitSize.assign(numVertices, 1);

  automorphisms.resize(numVertices * 64);
  numAutomorphisms = 0;
  currNodeCertificate.reserve(numVertices);
}